

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_punpk_p_aarch64(void *vd,void *vn,uint32_t pred_desc)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ARMPredicateReg tmp_n;
  undefined1 local_48 [32];
  
  uVar2 = pred_desc & 0x1f;
  uVar1 = uVar2 + 2;
  uVar5 = pred_desc >> 0xc & 1;
  if (uVar2 < 7) {
    uVar3 = extract64(*vn,uVar5 * uVar1 * 4,uVar1 * 4);
    uVar3 = expand_bits(uVar3,0);
    *(uint64_t *)vd = uVar3;
  }
  else {
    if ((ulong)((long)vn - (long)vd) < (ulong)uVar1) {
      memcpy(local_48,vn,(ulong)uVar1);
      vn = local_48;
    }
    uVar4 = 0;
    if (uVar5 != 0) {
      uVar4 = (ulong)(uVar1 >> 1);
    }
    if ((uVar4 & 3) == 0) {
      for (uVar6 = 0; uVar2 + 9 >> 3 != uVar6; uVar6 = uVar6 + 1) {
        uVar3 = expand_bits((ulong)*(uint *)((long)vn +
                                            uVar6 * 4 + (ulong)((uint)uVar4 & 0xfffffffc)),0);
        *(uint64_t *)((long)vd + uVar6 * 8) = uVar3;
      }
    }
    else {
      for (uVar6 = 0; uVar1 >> 1 != uVar6; uVar6 = uVar6 + 1) {
        uVar3 = expand_bits((ulong)*(byte *)((long)vn + uVar6 + uVar4),0);
        *(short *)((long)vd + uVar6 * 2) = (short)uVar3;
      }
    }
  }
  return;
}

Assistant:

void HELPER(sve_punpk_p)(void *vd, void *vn, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    intptr_t high = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd;
    intptr_t i;

    if (oprsz <= 8) {
        uint64_t nn = *(uint64_t *)vn;
        int half = 4 * oprsz;

        nn = extract64(nn, high * half, half);
        nn = expand_bits(nn, 0);
        d[0] = nn;
    } else {
        ARMPredicateReg tmp_n;

        /* We produce output faster than we consume input.
           Therefore we must be mindful of possible overlap.  */
        if (((char *)vn - (char *)vd) < (uintptr_t)oprsz) {
            vn = memcpy(&tmp_n, vn, oprsz);
        }
        if (high) {
            high = oprsz >> 1;
        }

        if ((high & 3) == 0) {
            uint32_t *n = vn;
            high >>= 2;

            for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
                uint64_t nn = n[H4(high + i)];
                d[i] = expand_bits(nn, 0);
            }
        } else {
            uint16_t *d16 = vd;
            uint8_t *n = vn;

            for (i = 0; i < oprsz / 2; i++) {
                uint16_t nn = n[H1(high + i)];
                d16[H2(i)] = expand_bits(nn, 0);
            }
        }
    }
}